

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fw_data_parser.c
# Opt level: O0

int image_fwdata_get_version2(igsc_fwdata_image *img,igsc_fwdata_version2 *version)

{
  long lVar1;
  int *piVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  long in_FS_OFFSET;
  igsc_log_func_t igsc_log_func;
  igsc_fwdata_metadata *meta;
  gsc_fwu_heci_image_metadata *metadata;
  igsc_fwdata_version2 *version_local;
  igsc_fwdata_image *img_local;
  char local_118 [8];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = (int *)(img->layout).table[0].content;
  if (*piVar2 == 0x401) {
    version->data_arb_svn = 0;
    version->format_version = 1;
  }
  else {
    if (*piVar2 != 0x402) {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_1 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
               ,"image_fwdata_get_version2",0x4c,*piVar2);
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(local_118,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
                  ,"image_fwdata_get_version2",0x4c,*piVar2);
      }
      img_local._4_4_ = 5;
      goto LAB_00127f71;
    }
    version->data_arb_svn = piVar2[4];
    version->format_version = 2;
  }
  version->flags = 0;
  version->data_arb_svn_fitb = 0;
  version->oem_manuf_data_version = piVar2[1];
  version->oem_manuf_data_version_fitb = 0;
  version->major_vcn = *(uint16_t *)((long)piVar2 + 10);
  version->major_version = *(uint16_t *)(piVar2 + 2);
  img_local._4_4_ = 0;
LAB_00127f71:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return img_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int image_fwdata_get_version2(struct igsc_fwdata_image* img,
                              struct igsc_fwdata_version2* version)
{
    struct gsc_fwu_heci_image_metadata* metadata = (struct gsc_fwu_heci_image_metadata*)img->layout.table[FWU_FPT_ENTRY_IMAGE_INFO].content;
    struct igsc_fwdata_metadata* meta = (struct igsc_fwdata_metadata*)&metadata->metadata;

    switch (metadata->metadata_format_version)
    {
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_1:
        version->data_arb_svn = 0;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_1;
        break;
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_2:
        version->data_arb_svn = meta->data_arb_svn;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_2;
        break;
    default:
        gsc_error("Bad version format %u\n", metadata->metadata_format_version);
        return IGSC_ERROR_BAD_IMAGE;
    }
    version->flags = 0;
    version->data_arb_svn_fitb = 0;
    version->oem_manuf_data_version = meta->oem_manuf_data_version;
    version->oem_manuf_data_version_fitb = 0;
    version->major_vcn = meta->major_vcn;
    version->major_version = meta->major_fw_version;

    return IGSC_SUCCESS;
}